

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg_test.c
# Opt level: O1

int main(void)

{
  MppEncCfg pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  MppEncCfg cfg;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  RK_S32 bps_target;
  RK_S32 rc_mode;
  RK_S32 aq_thrd_i [16];
  RK_S32 aq_thrd_i_ret [16];
  
  mpp_enc_cfg_show();
  _mpp_log_l(4,"mpp_enc_cfg_test","mpp_enc_cfg_test start\n",0);
  iVar2 = mpp_enc_cfg_init(&cfg);
  pvVar1 = cfg;
  if (iVar2 == 0) {
    rc_mode = 1;
    bps_target = 400000;
    aq_thrd_i[0] = 0;
    aq_thrd_i[1] = 0;
    aq_thrd_i[2] = 0;
    aq_thrd_i[3] = 0;
    aq_thrd_i[4] = 3;
    aq_thrd_i[5] = 3;
    aq_thrd_i[6] = 5;
    aq_thrd_i[7] = 5;
    aq_thrd_i[8] = 8;
    aq_thrd_i[9] = 8;
    aq_thrd_i[10] = 8;
    aq_thrd_i[0xb] = 0xf;
    aq_thrd_i[0xc] = 0xf;
    aq_thrd_i[0xd] = 0x14;
    aq_thrd_i[0xe] = 0x19;
    aq_thrd_i[0xf] = 0x23;
    aq_thrd_i_ret[0] = -1;
    aq_thrd_i_ret[1] = -1;
    aq_thrd_i_ret[2] = -1;
    aq_thrd_i_ret[3] = -1;
    aq_thrd_i_ret[4] = -1;
    aq_thrd_i_ret[5] = -1;
    aq_thrd_i_ret[6] = -1;
    aq_thrd_i_ret[7] = -1;
    aq_thrd_i_ret[8] = -1;
    aq_thrd_i_ret[9] = -1;
    aq_thrd_i_ret[10] = -1;
    aq_thrd_i_ret[0xb] = -1;
    aq_thrd_i_ret[0xc] = -1;
    aq_thrd_i_ret[0xd] = -1;
    aq_thrd_i_ret[0xe] = -1;
    aq_thrd_i_ret[0xf] = -1;
    _mpp_log_l(4,"mpp_enc_cfg_test","before set: rc mode %d bps_target %d\n",0,
               *(undefined4 *)((long)cfg + 0x9c),*(undefined4 *)((long)cfg + 0xa4));
    lVar3 = mpp_time();
    mpp_enc_cfg_set_u32(cfg,"rc:mode",rc_mode);
    mpp_enc_cfg_set_s32(cfg,"rc:mode",rc_mode);
    mpp_enc_cfg_set_s32(cfg,"rc:bps",400000);
    mpp_enc_cfg_set_s32(cfg,"rc:bps_target",bps_target);
    lVar4 = mpp_time();
    _mpp_log_l(4,"mpp_enc_cfg_test","set s32 time %lld us\n",0,lVar4 - lVar3);
    _mpp_log_l(4,"mpp_enc_cfg_test","after  set: rc mode %d bps_target %d\n",0,
               *(undefined4 *)((long)pvVar1 + 0x9c),*(undefined4 *)((long)pvVar1 + 0xa4));
    rc_mode = 0;
    bps_target = 0;
    _mpp_log_l(4,"mpp_enc_cfg_test","before get: rc mode %d bps_target %d\n",0,0,0);
    mpp_enc_cfg_get_s32(cfg,"rc:mode",&rc_mode);
    mpp_enc_cfg_get_s32(cfg,"rc:bps_target",&bps_target);
    _mpp_log_l(4,"mpp_enc_cfg_test","after  get: rc mode %d bps_target %d\n",0,rc_mode,bps_target);
    local_d0 = (ulong)(uint)aq_thrd_i_ret[2];
    local_d8 = (ulong)(uint)aq_thrd_i_ret[3];
    local_e0 = (ulong)(uint)aq_thrd_i_ret[4];
    local_e8 = (ulong)(uint)aq_thrd_i_ret[5];
    local_f0 = (ulong)(uint)aq_thrd_i_ret[6];
    local_f8 = (ulong)(uint)aq_thrd_i_ret[7];
    local_c8 = (ulong)(uint)aq_thrd_i_ret[8];
    _mpp_log_l(4,"mpp_enc_cfg_test",
               "before set: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n"
               ,0,aq_thrd_i_ret[0],aq_thrd_i_ret[1],local_d0,local_d8,local_e0,local_e8,local_f0,
               local_f8,local_c8,aq_thrd_i_ret[9],aq_thrd_i_ret[10],aq_thrd_i_ret[0xb],
               aq_thrd_i_ret[0xc],aq_thrd_i_ret[0xd],aq_thrd_i_ret[0xe],aq_thrd_i_ret[0xf]);
    mpp_enc_cfg_set_st(cfg,"hw:aq_step_i",aq_thrd_i);
    mpp_enc_cfg_get_st(cfg,"hw:aq_step_i",aq_thrd_i_ret);
    local_d0 = (ulong)(uint)aq_thrd_i_ret[2];
    local_d8 = (ulong)(uint)aq_thrd_i_ret[3];
    local_e0 = (ulong)(uint)aq_thrd_i_ret[4];
    local_e8 = (ulong)(uint)aq_thrd_i_ret[5];
    local_f0 = (ulong)(uint)aq_thrd_i_ret[6];
    local_f8 = (ulong)(uint)aq_thrd_i_ret[7];
    iVar6 = 0;
    _mpp_log_l(4,"mpp_enc_cfg_test",
               "after  get: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n"
               ,0,aq_thrd_i_ret[0],aq_thrd_i_ret[1],local_d0,local_d8,local_e0,local_e8,local_f0,
               local_f8,aq_thrd_i_ret[8],aq_thrd_i_ret[9],aq_thrd_i_ret[10],aq_thrd_i_ret[0xb],
               aq_thrd_i_ret[0xc],aq_thrd_i_ret[0xd],aq_thrd_i_ret[0xe],aq_thrd_i_ret[0xf]);
    iVar2 = mpp_enc_cfg_deinit(cfg);
    if (iVar2 == 0) goto LAB_00101581;
    pcVar5 = "mpp_enc_cfg_deinit failed\n";
  }
  else {
    pcVar5 = "mpp_enc_cfg_init failed\n";
  }
  _mpp_log_l(2,"mpp_enc_cfg_test",pcVar5,0);
  iVar6 = iVar2;
LAB_00101581:
  pcVar5 = "failed";
  if (iVar6 == 0) {
    pcVar5 = "success";
  }
  _mpp_log_l(4,"mpp_enc_cfg_test","mpp_enc_cfg_test done %s\n",0,pcVar5);
  return iVar6;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppEncCfg cfg;
    RK_S64 end = 0;
    RK_S64 start = 0;

    mpp_enc_cfg_show();

    mpp_log("mpp_enc_cfg_test start\n");

    ret = mpp_enc_cfg_init(&cfg);
    if (ret) {
        mpp_err("mpp_enc_cfg_init failed\n");
        goto DONE;
    }

    RK_S32 rc_mode = 1;
    RK_S32 bps_target = 400000;
    RK_S32 aq_thrd_i[16] = {
        0,  0,  0,  0,
        3,  3,  5,  5,
        8,  8,  8,  15,
        15, 20, 25, 35
    };

    RK_S32 aq_thrd_i_ret[16] = {
        -1, -1, -1, -1,
        -1, -1, -1, -1,
        -1, -1, -1, -1,
        -1, -1, -1, -1,
    };

    MppEncCfgImpl *impl = (MppEncCfgImpl *)cfg;

    mpp_log("before set: rc mode %d bps_target %d\n",
            impl->cfg.rc.rc_mode, impl->cfg.rc.bps_target);

    start = mpp_time();
    ret = mpp_enc_cfg_set_u32(cfg, "rc:mode", rc_mode);
    ret = mpp_enc_cfg_set_s32(cfg, "rc:mode", rc_mode);
    ret = mpp_enc_cfg_set_s32(cfg, "rc:bps", 400000);
    ret = mpp_enc_cfg_set_s32(cfg, "rc:bps_target", bps_target);
    end = mpp_time();
    mpp_log("set s32 time %lld us\n", end - start);

    mpp_log("after  set: rc mode %d bps_target %d\n",
            impl->cfg.rc.rc_mode, impl->cfg.rc.bps_target);

    rc_mode = 0;
    bps_target = 0;

    mpp_log("before get: rc mode %d bps_target %d\n", rc_mode, bps_target);

    ret = mpp_enc_cfg_get_s32(cfg, "rc:mode", &rc_mode);
    ret = mpp_enc_cfg_get_s32(cfg, "rc:bps_target", &bps_target);
    mpp_log("after  get: rc mode %d bps_target %d\n", rc_mode, bps_target);

    mpp_log("before set: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n",
            aq_thrd_i_ret[0], aq_thrd_i_ret[1], aq_thrd_i_ret[2], aq_thrd_i_ret[3],
            aq_thrd_i_ret[4], aq_thrd_i_ret[5], aq_thrd_i_ret[6], aq_thrd_i_ret[7],
            aq_thrd_i_ret[8], aq_thrd_i_ret[9], aq_thrd_i_ret[10], aq_thrd_i_ret[11],
            aq_thrd_i_ret[12], aq_thrd_i_ret[13], aq_thrd_i_ret[14], aq_thrd_i_ret[15]);

    ret = mpp_enc_cfg_set_st(cfg, "hw:aq_step_i", aq_thrd_i);
    ret = mpp_enc_cfg_get_st(cfg, "hw:aq_step_i", aq_thrd_i_ret);

    mpp_log("after  get: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n",
            aq_thrd_i_ret[0], aq_thrd_i_ret[1], aq_thrd_i_ret[2], aq_thrd_i_ret[3],
            aq_thrd_i_ret[4], aq_thrd_i_ret[5], aq_thrd_i_ret[6], aq_thrd_i_ret[7],
            aq_thrd_i_ret[8], aq_thrd_i_ret[9], aq_thrd_i_ret[10], aq_thrd_i_ret[11],
            aq_thrd_i_ret[12], aq_thrd_i_ret[13], aq_thrd_i_ret[14], aq_thrd_i_ret[15]);

    ret = mpp_enc_cfg_deinit(cfg);
    if (ret) {
        mpp_err("mpp_enc_cfg_deinit failed\n");
        goto DONE;
    }

DONE:
    mpp_log("mpp_enc_cfg_test done %s\n", ret ? "failed" : "success");
    return ret;
}